

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan.c
# Opt level: O3

parasail_result_t *
parasail_sw_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  uint uVar1;
  int *piVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong size;
  size_t size_00;
  ulong uVar8;
  int a;
  int iVar9;
  ulong uVar10;
  int iVar11;
  size_t size_01;
  int *__s;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int *local_78;
  long lVar15;
  
  uVar7 = (ulong)(uint)_s1Len;
  if (_s2 == (char *)0x0) {
    parasail_sw_rowcol_scan_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_rowcol_scan_cold_6();
  }
  else if (open < 0) {
    parasail_sw_rowcol_scan_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_rowcol_scan_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_rowcol_scan_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_rowcol_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_rowcol_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar7 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar7;
    iVar4 = s2Len;
    ppVar3 = parasail_result_new_rowcol1(a,s2Len);
    if (ppVar3 != (parasail_result_t *)0x0) {
      ppVar3->flag = ppVar3->flag | 0x1440204;
      size = (ulong)(uint)s2Len;
      ptr = parasail_memalign_int(0x10,size);
      size_01 = (size_t)(a + 1);
      ptr_00 = parasail_memalign_int(0x10,size_01);
      size_00 = (size_t)a;
      ptr_01 = parasail_memalign_int(0x10,size_00);
      ptr_02 = parasail_memalign_int(0x10,size_01);
      ptr_03 = parasail_memalign_int(0x10,size_01);
      auVar12._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
      auVar12._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
      auVar12._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
      auVar12._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
      iVar4 = movmskps(iVar4,auVar12);
      if (iVar4 != 0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (matrix->type == 0) {
        local_78 = parasail_memalign_int(0x10,size_00);
        if (local_78 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (0 < a) {
          piVar2 = matrix->mapper;
          uVar5 = 0;
          do {
            local_78[uVar5] = piVar2[(byte)_s1[uVar5]];
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
      }
      else {
        local_78 = (int *)0x0;
      }
      __s = ptr_00 + 1;
      piVar2 = matrix->mapper;
      uVar5 = 0;
      do {
        ptr[uVar5] = piVar2[(byte)_s2[uVar5]];
        uVar5 = uVar5 + 1;
      } while (size != uVar5);
      *ptr_00 = 0;
      *ptr_02 = 0;
      if (a < 1) {
        *ptr_03 = -0x40000000;
      }
      else {
        memset(__s,0,uVar7 * 4);
        lVar6 = 0;
        *ptr_03 = -0x40000000;
        auVar12 = _DAT_00903aa0;
        lVar15 = uVar7 - 1;
        auVar13._8_4_ = (int)lVar15;
        auVar13._0_8_ = lVar15;
        auVar13._12_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar13 = auVar13 ^ _DAT_00903aa0;
        auVar14 = _DAT_00903a80;
        auVar16 = _DAT_00903a90;
        do {
          auVar17 = auVar16 ^ auVar12;
          iVar4 = auVar13._4_4_;
          if ((bool)(~(auVar17._4_4_ == iVar4 && auVar13._0_4_ < auVar17._0_4_ ||
                      iVar4 < auVar17._4_4_) & 1)) {
            *(undefined4 *)((long)ptr_01 + lVar6) = 0xc0000000;
          }
          if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
              auVar17._12_4_ <= auVar13._12_4_) {
            *(undefined4 *)((long)ptr_01 + lVar6 + 4) = 0xc0000000;
          }
          auVar17 = auVar14 ^ auVar12;
          iVar11 = auVar17._4_4_;
          if (iVar11 <= iVar4 && (iVar11 != iVar4 || auVar17._0_4_ <= auVar13._0_4_)) {
            *(undefined4 *)((long)ptr_01 + lVar6 + 8) = 0xc0000000;
            *(undefined4 *)((long)ptr_01 + lVar6 + 0xc) = 0xc0000000;
          }
          lVar15 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar15 + 4;
          lVar15 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar15 + 4;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)(a + 3U >> 2) << 4 != lVar6);
      }
      uVar1 = s2Len - 1;
      iVar4 = -0x40000000;
      uVar8 = 0;
      uVar5 = uVar7;
      do {
        if (0 < a) {
          uVar10 = 0;
          do {
            iVar11 = __s[uVar10] - open;
            if (__s[uVar10] - open < ptr_01[uVar10] - gap) {
              iVar11 = ptr_01[uVar10] - gap;
            }
            ptr_01[uVar10] = iVar11;
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
          if (0 < a) {
            piVar2 = matrix->matrix;
            uVar10 = 0;
            do {
              if (matrix->type == 0) {
                iVar11 = local_78[uVar10];
              }
              else {
                iVar11 = (int)uVar10;
              }
              iVar11 = ptr_00[uVar10] + piVar2[(long)(matrix->size * iVar11) + (long)ptr[uVar8]];
              if (iVar11 <= ptr_01[uVar10]) {
                iVar11 = ptr_01[uVar10];
              }
              ptr_02[uVar10 + 1] = iVar11;
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
            if (0 < a) {
              iVar11 = *ptr_03;
              uVar10 = 0;
              do {
                iVar11 = iVar11 - gap;
                if (iVar11 <= ptr_02[uVar10]) {
                  iVar11 = ptr_02[uVar10];
                }
                ptr_03[uVar10 + 1] = iVar11;
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
              if (0 < a) {
                uVar10 = 0;
                iVar11 = iVar4;
                do {
                  iVar9 = ptr_03[uVar10 + 1] - open;
                  if (ptr_03[uVar10 + 1] - open < ptr_02[uVar10 + 1]) {
                    iVar9 = ptr_02[uVar10 + 1];
                  }
                  if (iVar9 < 1) {
                    iVar9 = 0;
                  }
                  __s[uVar10] = iVar9;
                  iVar4 = iVar11;
                  if (iVar11 < iVar9) {
                    uVar5 = uVar10 & 0xffffffff;
                    iVar4 = iVar9;
                  }
                  if (iVar11 < iVar9) {
                    s2Len = (int)uVar8;
                  }
                  uVar10 = uVar10 + 1;
                  iVar11 = iVar4;
                } while (uVar7 != uVar10);
                if (uVar8 == uVar1 && 0 < a) {
                  uVar10 = 0;
                  do {
                    ((ppVar3->field_4).rowcols)->score_col[uVar10] = __s[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar7 != uVar10);
                }
              }
            }
          }
        }
        ((ppVar3->field_4).rowcols)->score_row[uVar8] = ptr_00[size_00];
        uVar8 = uVar8 + 1;
      } while (uVar8 != size);
      ppVar3->score = iVar4;
      ppVar3->end_query = (int)uVar5;
      ppVar3->end_ref = s2Len;
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      if (matrix->type == 0) {
        parasail_free(local_78);
        return ppVar3;
      }
      return ppVar3;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H  = NULL;
    int * restrict E  = NULL;
    int * restrict HtB= NULL;
    int * restrict Ht = NULL;
    int * restrict FtB= NULL;
    int * restrict Ft = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    FtB= parasail_memalign_int(16, s1Len+1);
    Ft = FtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!FtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = 0;
    }
    Ft[-1] = NEG_INF_32;

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        /* calculate Ft */
        for (i=0; i<s1Len; ++i) {
            Ft[i] = MAX(Ft[i-1]-gap, Ht[i-1]);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            H[i] = MAX(Ht[i], Ft[i]-open);
            H[i] = MAX(H[i], 0);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
            if (H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->rowcols->score_col[i] = H[i];
            }
        }
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(FtB);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}